

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::TIntermediate::foldSwizzle
          (TIntermediate *this,TIntermTyped *node,TSwizzleSelectors<int> *selectors,TSourceLoc *loc)

{
  long lVar1;
  pointer pTVar2;
  int iVar3;
  TBasicType t;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  TIntermConstantUnion *pTVar5;
  long lVar6;
  long lVar7;
  TConstUnionArray constArray;
  TConstUnionArray local_d0;
  TType local_c0;
  
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])(node);
  TConstUnionArray::TConstUnionArray(&local_d0,selectors->size_);
  if (0 < selectors->size_) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      if (lVar6 == 4) {
        __assert_fail("i < MaxSwizzleSelectors",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/localintermediate.h"
                      ,0x54,
                      "selectorType glslang::TSwizzleSelectors<int>::operator[](int) const [selectorType = int]"
                     );
      }
      lVar1 = *(long *)(*(long *)(CONCAT44(extraout_var,iVar3) + 0xc0) + 8);
      lVar7 = (long)selectors->components[lVar6] * 0x10;
      pTVar2 = ((local_d0.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)((long)&pTVar2->type + lVar4) = *(undefined4 *)(lVar1 + 8 + lVar7);
      *(undefined8 *)((long)&pTVar2->field_0 + lVar4) = *(undefined8 *)(lVar1 + lVar7);
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar6 < selectors->size_);
  }
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  pTVar5 = addConstantUnion(this,&local_d0,(TType *)CONCAT44(extraout_var_00,iVar3),loc,false);
  if (pTVar5 != (TIntermConstantUnion *)0x0) {
    t = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
    TType::TType(&local_c0,t,EvqConst,selectors->size_,0,0,false);
    (*(pTVar5->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])(pTVar5,&local_c0);
    node = &pTVar5->super_TIntermTyped;
  }
  return &((TIntermConstantUnion *)node)->super_TIntermTyped;
}

Assistant:

TIntermTyped* TIntermediate::foldSwizzle(TIntermTyped* node, TSwizzleSelectors<TVectorSelector>& selectors, const TSourceLoc& loc)
{
    const TConstUnionArray& unionArray = node->getAsConstantUnion()->getConstArray();
    TConstUnionArray constArray(selectors.size());

    for (int i = 0; i < selectors.size(); i++)
        constArray[i] = unionArray[selectors[i]];

    TIntermTyped* result = addConstantUnion(constArray, node->getType(), loc);

    if (result == nullptr)
        result = node;
    else
        result->setType(TType(node->getBasicType(), EvqConst, selectors.size()));

    return result;
}